

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void boost::deflate::inflate_stream_test::testInvalidHeader(IDecompressor *d)

{
  inflate_stream_test *piVar1;
  error_code expected;
  error_code expected_00;
  error_code expected_01;
  error_code expected_02;
  error_code expected_03;
  error_code expected_04;
  error_code expected_05;
  error_code expected_06;
  initializer_list<unsigned_char> *local_278;
  error_category *local_270;
  _func_int *local_264;
  undefined8 local_25c;
  undefined4 local_254;
  IDecompressor local_250;
  undefined8 local_248;
  string local_240;
  initializer_list<unsigned_char> *local_220;
  error_category *local_218;
  _func_int *local_20c;
  undefined8 local_204;
  undefined4 local_1fc;
  IDecompressor local_1f8;
  undefined8 local_1f0;
  string local_1e8;
  initializer_list<unsigned_char> *local_1c8;
  error_category *local_1c0;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  IDecompressor local_1a8;
  undefined8 local_1a0;
  string local_198;
  initializer_list<unsigned_char> *local_178;
  error_category *local_170;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  IDecompressor local_160;
  undefined8 local_158;
  string local_150;
  initializer_list<unsigned_char> *local_130;
  error_category *local_128;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  IDecompressor local_118;
  undefined8 local_110;
  string local_108;
  initializer_list<unsigned_char> *local_e8;
  error_category *local_e0;
  undefined1 local_d2;
  undefined1 local_d1;
  IDecompressor local_d0;
  undefined8 local_c8;
  string local_c0;
  initializer_list<unsigned_char> *local_a0;
  error_category *local_98;
  undefined1 local_8a;
  undefined1 local_89;
  IDecompressor local_88;
  undefined8 local_80;
  string local_78;
  initializer_list<unsigned_char> *local_58;
  error_category *local_50;
  undefined1 local_42;
  undefined1 local_41;
  IDecompressor local_40;
  undefined8 local_38;
  string local_30;
  inflate_stream_test *local_10;
  IDecompressor *d_local;
  
  local_42 = 0x14;
  local_41 = 0;
  local_40._vptr_IDecompressor = (_func_int **)&local_42;
  local_38 = 2;
  local_10 = (inflate_stream_test *)d;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_58,incorrect_header_check,(type *)0x0);
  expected.cat_ = (error_category *)0x1;
  expected._0_8_ = local_50;
  check_abi_cxx11_(&local_30,(inflate_stream_test *)d,&local_40,local_58,expected,0xf,
                   0xffffffffffffffff,(size_t)d);
  std::__cxx11::string::~string((string *)&local_30);
  piVar1 = local_10;
  local_8a = 0x17;
  local_89 = 2;
  local_88._vptr_IDecompressor = (_func_int **)&local_8a;
  local_80 = 2;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_a0,unknown_compression_method,(type *)0x0);
  expected_00.cat_ = (error_category *)0x1;
  expected_00._0_8_ = local_98;
  check_abi_cxx11_(&local_78,piVar1,&local_88,local_a0,expected_00,0xf,0xffffffffffffffff,(size_t)d)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  piVar1 = local_10;
  local_d2 = 0xf8;
  local_d1 = 0;
  local_d0._vptr_IDecompressor = (_func_int **)&local_d2;
  local_c8 = 2;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_e8,invalid_window_size,(type *)0x0);
  expected_01.cat_ = (error_category *)0x1;
  expected_01._0_8_ = local_e0;
  check_abi_cxx11_(&local_c0,piVar1,&local_d0,local_e8,expected_01,10,0xffffffffffffffff,(size_t)d);
  std::__cxx11::string::~string((string *)&local_c0);
  piVar1 = local_10;
  local_11c = 0x1f;
  local_11b = 0x8b;
  local_11a = 7;
  local_119 = 0;
  local_118._vptr_IDecompressor = (_func_int **)&local_11c;
  local_110 = 4;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_130,unknown_compression_method,(type *)0x0);
  expected_02.cat_ = (error_category *)0x2;
  expected_02._0_8_ = local_128;
  check_abi_cxx11_(&local_108,piVar1,&local_118,local_130,expected_02,0xf,0xffffffffffffffff,
                   (size_t)d);
  std::__cxx11::string::~string((string *)&local_108);
  piVar1 = local_10;
  local_164 = 0x1f;
  local_163 = 0x8b;
  local_162 = 8;
  local_161 = 0xe0;
  local_160._vptr_IDecompressor = (_func_int **)&local_164;
  local_158 = 4;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_178,unknown_header_flags,(type *)0x0);
  expected_03.cat_ = (error_category *)0x2;
  expected_03._0_8_ = local_170;
  check_abi_cxx11_(&local_150,piVar1,&local_160,local_178,expected_03,0xf,0xffffffffffffffff,
                   (size_t)d);
  std::__cxx11::string::~string((string *)&local_150);
  piVar1 = local_10;
  local_1b4 = 0x1f;
  local_1b3 = 0x8b;
  local_1b2 = 8;
  local_1b1 = 2;
  local_1b0 = 0;
  local_1af = 0;
  local_1ae = 0;
  local_1ad = 0;
  local_1ac = 4;
  local_1ab = 3;
  local_1aa = 0xff;
  local_1a9 = 0xff;
  local_1a8._vptr_IDecompressor = (_func_int **)&local_1b4;
  local_1a0 = 0xc;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_1c8,header_crc_mismatch,(type *)0x0);
  expected_04.cat_ = (error_category *)0x2;
  expected_04._0_8_ = local_1c0;
  check_abi_cxx11_(&local_198,piVar1,&local_1a8,local_1c8,expected_04,0xf,0xffffffffffffffff,
                   (size_t)d);
  std::__cxx11::string::~string((string *)&local_198);
  piVar1 = local_10;
  local_20c = (_func_int *)0x88b1f;
  local_204 = 0x100000000030304;
  local_1fc = 0;
  local_1f8._vptr_IDecompressor = &local_20c;
  local_1f0 = 0x14;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_220,incorrect_data_check,(type *)0x0);
  expected_05.cat_ = (error_category *)0x2;
  expected_05._0_8_ = local_218;
  check_abi_cxx11_(&local_1e8,piVar1,&local_1f8,local_220,expected_05,0xf,0xffffffffffffffff,
                   (size_t)d);
  std::__cxx11::string::~string((string *)&local_1e8);
  piVar1 = local_10;
  local_264 = (_func_int *)0x88b1f;
  local_25c = 0x30304;
  local_254 = 0x1000000;
  local_250._vptr_IDecompressor = &local_264;
  local_248 = 0x14;
  system::error_code::error_code<boost::deflate::error>
            ((error_code *)&local_278,incorrect_length_check,(type *)0x0);
  expected_06.cat_ = (error_category *)0x2;
  expected_06._0_8_ = local_270;
  check_abi_cxx11_(&local_240,piVar1,&local_250,local_278,expected_06,0xf,0xffffffffffffffff,
                   (size_t)d);
  std::__cxx11::string::~string((string *)&local_240);
  return;
}

Assistant:

static
    void testInvalidHeader(IDecompressor& d)
    {
        check(d, {0x14, 0x00}, error::incorrect_header_check, boost::deflate::wrap::zlib);
        check(d, {0x17, 0x02}, error::unknown_compression_method, boost::deflate::wrap::zlib);
        check(d, {0xf8, 0x00}, error::invalid_window_size, boost::deflate::wrap::zlib, 10);
        check(d, {0x1f, 0x8b, 0x07, 0x00}, error::unknown_compression_method, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0xe0}, error::unknown_header_flags, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x02, 0x00, 0x00, 0x00, 0x00, 0x04,
                  0x03, 0xff, 0xff}, error::header_crc_mismatch, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00}, error::incorrect_data_check, boost::deflate::wrap::gzip);
        check(d, {0x1f, 0x8b, 0x08, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x04, 0x03, 0x03, 0x00,
                  0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01}, error::incorrect_length_check, boost::deflate::wrap::gzip);
    }